

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> __thiscall
anon_unknown.dwarf_19b33::createSamplePublisher(anon_unknown_dwarf_19b33 *this,Value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Publisher *this_00;
  int size;
  Value *pVVar2;
  invalid_argument *this_01;
  pointer *__ptr;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"bind","");
  pVVar2 = toml::Value::find(v,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (pVVar2 != (Value *)0x0) {
    toml::Value::
    ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_48,pVVar2);
    SamplePublisher::create((string *)this);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"send_buffer","");
    pVVar2 = toml::Value::find(v,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (pVVar2 != (Value *)0x0) {
      this_00 = *(Publisher **)this;
      size = toml::Value::ValueConverter<int>::to((ValueConverter<int> *)&local_48,pVVar2);
      Publisher::setSendBuffer(this_00,size);
    }
    return (__uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true>)
           (__uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true>)this;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Expected publisher section to have \"bind\" key")
  ;
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<SamplePublisher> createSamplePublisher(const toml::Value& v) {
  auto bind = v.find("bind");
  if (!bind) {
    throw std::invalid_argument(
        "Expected publisher section to have \"bind\" key");
  }

  // Only need bind value to create publisher
  auto p = SamplePublisher::create(bind->as<std::string>());

  // Optional send buffer size
  auto sendBuffer = v.find("send_buffer");
  if (sendBuffer) {
    p->setSendBuffer(sendBuffer->as<int>());
  }

  return p;
}